

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

z_crc_t x2nmodp(off_t n,uint k)

{
  z_crc_t local_18;
  uint local_14;
  z_crc_t p;
  uint k_local;
  off_t n_local;
  
  local_18 = 0x80000000;
  local_14 = k;
  for (_p = n; _p != 0; _p = (long)_p >> 1) {
    if ((_p & 1) != 0) {
      local_18 = multmodp(x2n_table[local_14 & 0x1f],local_18);
    }
    local_14 = local_14 + 1;
  }
  return local_18;
}

Assistant:

local z_crc_t x2nmodp(z_off64_t n, unsigned k) {
    z_crc_t p;

    p = (z_crc_t)1 << 31;           /* x^0 == 1 */
    while (n) {
        if (n & 1)
            p = multmodp(x2n_table[k & 31], p);
        n >>= 1;
        k++;
    }
    return p;
}